

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rigid-body-kinematics.hxx
# Opt level: O0

Vector3 * __thiscall
stateObservation::kine::Orientation::operator*
          (Vector3 *__return_storage_ptr__,Orientation *this,Vector3 *v)

{
  bool bVar1;
  MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *this_00;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_30;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *local_20;
  Vector3 *v_local;
  Orientation *this_local;
  
  local_20 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)v;
  v_local = (Vector3 *)this;
  this_local = (Orientation *)__return_storage_ptr__;
  check_(this);
  bVar1 = isMatrixSet(this);
  if (!bVar1) {
    quaternionToMatrix_(this);
  }
  this_00 = (MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)
            CheckedItem<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_false,_false,_true,_true>::operator()
                      (&this->m_);
  local_30 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*(this_00,local_20);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
            ((Matrix<double,3,1,0,3,1> *)__return_storage_ptr__,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
              *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

inline Vector3 Orientation::operator*(const Vector3 & v) const
{
  check_();
  if(!isMatrixSet())
  {
    quaternionToMatrix_();
  }
  return m_() * v;
}